

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 4.hpp
# Opt level: O3

void __thiscall njoy::ENDFtk::section::Type<7,_4>::~Type(Type<7,_4> *this)

{
  pointer pdVar1;
  pointer plVar2;
  
  std::
  vector<std::optional<njoy::ENDFtk::section::Type<7,_4>::EffectiveTemperature>,_std::allocator<std::optional<njoy::ENDFtk::section::Type<7,_4>::EffectiveTemperature>_>_>
  ::~vector(&this->secondary_);
  pdVar1 = (this->principal_).super_TabulationRecord.yValues.
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_start;
  if (pdVar1 != (pointer)0x0) {
    operator_delete(pdVar1,(long)(this->principal_).super_TabulationRecord.yValues.
                                 super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage - (long)pdVar1);
  }
  pdVar1 = (this->principal_).super_TabulationRecord.xValues.
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_start;
  if (pdVar1 != (pointer)0x0) {
    operator_delete(pdVar1,(long)(this->principal_).super_TabulationRecord.xValues.
                                 super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage - (long)pdVar1);
  }
  plVar2 = (this->principal_).super_TabulationRecord.super_InterpolationBase.
           interpolationSchemeIndices.super__Vector_base<long,_std::allocator<long>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (plVar2 != (pointer)0x0) {
    operator_delete(plVar2,(long)*(pointer *)
                                  ((long)&(this->principal_).super_TabulationRecord.
                                          super_InterpolationBase.interpolationSchemeIndices.
                                          super__Vector_base<long,_std::allocator<long>_>._M_impl.
                                          super__Vector_impl_data + 0x10) - (long)plVar2);
  }
  plVar2 = (this->principal_).super_TabulationRecord.super_InterpolationBase.boundaryIndices.
           super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start;
  if (plVar2 != (pointer)0x0) {
    operator_delete(plVar2,(long)*(pointer *)
                                  ((long)&(this->principal_).super_TabulationRecord.
                                          super_InterpolationBase.boundaryIndices.
                                          super__Vector_base<long,_std::allocator<long>_>._M_impl.
                                          super__Vector_impl_data + 0x10) - (long)plVar2);
  }
  std::__detail::__variant::
  _Variant_storage<false,_njoy::ENDFtk::section::Type<7,_4>::AnalyticalFunctions,_njoy::ENDFtk::section::Type<7,_4>::TabulatedFunctions>
  ::~_Variant_storage((_Variant_storage<false,_njoy::ENDFtk::section::Type<7,_4>::AnalyticalFunctions,_njoy::ENDFtk::section::Type<7,_4>::TabulatedFunctions>
                       *)&this->law_);
  pdVar1 = (this->b_).super_ListRecord.data.super__Vector_base<double,_std::allocator<double>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (pdVar1 != (pointer)0x0) {
    operator_delete(pdVar1,(long)(this->b_).super_ListRecord.data.
                                 super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage - (long)pdVar1);
    return;
  }
  return;
}

Assistant:

class ENDFTK_PYTHON_EXPORT Type< 7, 4 > : 
    protected BaseWithoutMT< Type< 7, 4 > > {

    friend BaseWithoutMT< Type< 7, 4 > >;

  public:

    #include "ENDFtk/section/7/4/ScatteringLawConstants.hpp"

    #include "ENDFtk/section/7/4/AnalyticalFunctions.hpp"
    #include "ENDFtk/section/7/4/TabulatedFunctions.hpp"

    #include "ENDFtk/section/7/4/EffectiveTemperature.hpp"

    /** @typedef ScatteringLaw
     *  @brief The incoherent inelastic scattering law of MF7/MT4
     *
     *  This scattering law class is set up as a variant because the incoherent
     *  inelastic scattering law in MF7/MT4 can either be a given as analytical
     *  functions or as a tabulated S(a,b) function.
     */
    using ScatteringLaw = std::variant< // B(1)=0
                                        AnalyticalFunctions,
                                        // B(1)!=0
                                        TabulatedFunctions >;

    /* type aliases */
    using OptionalEffectiveTemperature = std::optional< EffectiveTemperature >;

  private:

    /* fields */
    int lat_;
    int lasym_;

    ScatteringLawConstants b_;
    ScatteringLaw law_;

    EffectiveTemperature principal_;
    std::vector< OptionalEffectiveTemperature > secondary_;

    /* auxiliary functions */
    #include "ENDFtk/section/7/4/src/readSecondaryTemperatures.hpp"
    #include "ENDFtk/section/7/4/src/readScatteringLaw.hpp"
    #include "ENDFtk/section/7/4/src/checkValue.hpp"
    #include "ENDFtk/section/7/4/src/verifySecondaryTemperatures.hpp"

  public:

    /* constructor */
    #include "ENDFtk/section/7/4/src/ctor.hpp"

    /* get methods */

    /**
     *  @brief Return the LAT flag (temperature flag for alpha and beta grid)
     */
    int LAT() const { return this->lat_; }

    /**
     *  @brief Return the LAT flag (temperature flag for alpha and beta grid)
     */
    int temperatureOption() const { return this->LAT(); }

    /**
     *  @brief Return the LASYM flag (S(alpha,beta) is symmetric or not)
     */
    int LASYM() const { return this->lasym_; }

    /**
     *  @brief Return the LASYM flag (S(alpha,beta) is symmetric or not)
     */
    int symmetryOption() const { return this->LASYM(); }

    /**
     *  @brief Return the thermal scattering law constants for the principal and
     *         and secondary scatterers (if any)
     */
    const ScatteringLawConstants& constants() const { return this->b_; }

    /**
     *  @brief Return the thermal scattering law (either analytical or tabulated)
     */
    const ScatteringLaw& scatteringLaw() const { return this->law_; }

    /**
     *  @brief Return the effective temperature for the principal scatterer
     */
    const EffectiveTemperature& principalEffectiveTemperature() const {

      return this->principal_;
    }

    /**
     *  @brief Return the effective temperatures for the secondary scatterers
     *         (if any are defined)
     */
    auto secondaryEffectiveTemperatures() const {

      return ranges::cpp20::views::all( this->secondary_ );
    }

    #include "ENDFtk/section/7/4/src/NC.hpp"
    #include "ENDFtk/section/7/4/src/print.hpp"

    /**
     *  @brief Return the MT number of the section
     */
    static constexpr int sectionNumber() { return 4; }

    using BaseWithoutMT::MT;
    using BaseWithoutMT::ZA;
    using BaseWithoutMT::targetIdentifier;
    using BaseWithoutMT::AWR;
    using BaseWithoutMT::atomicWeightRatio;
  }